

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O3

void __thiscall HEkk::setNonbasicMove(HEkk *this)

{
  vector<signed_char,_std::allocator<signed_char>_> *this_00;
  bool bVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  ulong uVar5;
  ulong __new_size;
  double dVar6;
  double val;
  
  __new_size = (long)(this->lp_).num_row_ + (long)(this->lp_).num_col_;
  this_00 = &(this->basis_).nonbasicMove_;
  std::vector<signed_char,_std::allocator<signed_char>_>::resize(this_00,__new_size);
  if (0 < (int)__new_size) {
    uVar5 = 0;
    do {
      if ((this->basis_).nonbasicFlag_.super__Vector_base<signed_char,_std::allocator<signed_char>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar5] == '\0') {
LAB_0033d43b:
        bVar3 = 0;
      }
      else {
        iVar4 = (this->lp_).num_col_;
        if ((long)uVar5 < (long)iVar4) {
          dVar6 = (this->lp_).col_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                  .super__Vector_impl_data._M_start[uVar5];
          val = (this->lp_).col_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar5];
        }
        else {
          iVar4 = (int)uVar5 - iVar4;
          dVar6 = -(this->lp_).row_upper_.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[iVar4];
          val = -(this->lp_).row_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar4];
        }
        if ((dVar6 == val) && (!NAN(dVar6) && !NAN(val))) goto LAB_0033d43b;
        bVar1 = highs_isInfinity(-dVar6);
        bVar2 = highs_isInfinity(val);
        if (bVar1) {
          bVar3 = bVar2 - 1;
        }
        else {
          bVar3 = 1;
          if (!bVar2) {
            bVar3 = -(ABS(val) <= ABS(dVar6)) | 1;
          }
        }
      }
      (this_00->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar5] = bVar3;
      uVar5 = uVar5 + 1;
    } while ((__new_size & 0xffffffff) != uVar5);
  }
  return;
}

Assistant:

void HEkk::setNonbasicMove() {
  const bool have_solution = false;
  // Don't have a simplex basis since nonbasicMove is not set up.

  // Assign nonbasicMove using as much information as is available
  double lower;
  double upper;
  const HighsInt num_tot = lp_.num_col_ + lp_.num_row_;
  basis_.nonbasicMove_.resize(num_tot);

  for (HighsInt iVar = 0; iVar < num_tot; iVar++) {
    if (!basis_.nonbasicFlag_[iVar]) {
      // Basic variable
      basis_.nonbasicMove_[iVar] = kNonbasicMoveZe;
      continue;
    }
    // Nonbasic variable
    if (iVar < lp_.num_col_) {
      lower = lp_.col_lower_[iVar];
      upper = lp_.col_upper_[iVar];
    } else {
      HighsInt iRow = iVar - lp_.num_col_;
      lower = -lp_.row_upper_[iRow];
      upper = -lp_.row_lower_[iRow];
    }
    int8_t move = kIllegalMoveValue;
    if (lower == upper) {
      // Fixed
      move = kNonbasicMoveZe;
    } else if (!highs_isInfinity(-lower)) {
      // Finite lower bound so boxed or lower
      if (!highs_isInfinity(upper)) {
        // Finite upper bound so boxed
        //
        // Determine the bound to set the value to according to, in order of
        // priority
        //
        // 1. Any solution value
        if (have_solution) {
          double midpoint = 0.5 * (lower + upper);
          double value = info_.workValue_[iVar];
          if (value < midpoint) {
            move = kNonbasicMoveUp;
          } else {
            move = kNonbasicMoveDn;
          }
        }
        // 2. Bound of original LP that is closer to zero
        if (move == kIllegalMoveValue) {
          if (fabs(lower) < fabs(upper)) {
            move = kNonbasicMoveUp;
          } else {
            move = kNonbasicMoveDn;
          }
        }
      } else {
        // Lower (since upper bound is infinite)
        move = kNonbasicMoveUp;
      }
    } else if (!highs_isInfinity(upper)) {
      // Upper
      move = kNonbasicMoveDn;
    } else {
      // FREE
      move = kNonbasicMoveZe;
    }
    assert(move != kIllegalMoveValue);
    basis_.nonbasicMove_[iVar] = move;
  }
}